

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<int>::GetSub(TPZMatrix<int> *this,TPZVec<long> *indices,TPZFMatrix<int> *block)

{
  long lVar1;
  int iVar2;
  TPZFMatrix<int> *this_00;
  long *plVar3;
  int *piVar4;
  TPZVec<long> *in_RSI;
  long *in_RDI;
  int64_t jel;
  int64_t iel;
  int64_t nel;
  long index;
  long index_00;
  
  this_00 = (TPZFMatrix<int> *)TPZVec<long>::NElements(in_RSI);
  for (index_00 = 0; index_00 < (long)this_00; index_00 = index_00 + 1) {
    for (index = 0; index < (long)this_00; index = index + 1) {
      plVar3 = TPZVec<long>::operator[](in_RSI,index_00);
      lVar1 = *plVar3;
      plVar3 = TPZVec<long>::operator[](in_RSI,index);
      iVar2 = (**(code **)(*in_RDI + 0x120))(in_RDI,lVar1,*plVar3);
      piVar4 = TPZFMatrix<int>::operator()(this_00,index_00,index);
      *piVar4 = iVar2;
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::GetSub(const TPZVec<int64_t> &indices,TPZFMatrix<TVar> &block) const
{
    int64_t nel = indices.NElements();
    int64_t iel,jel;
    for(iel=0; iel<nel; iel++)
    {
		for(jel=0; jel<nel; jel++)
		{
			block(iel,jel) = GetVal(indices[iel],indices[jel]);
		}
    }
	
}